

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteStandard<duckdb::string_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::UnaryStringOperator<duckdb::Base64DecodeOperator>>
               (Vector *input,Vector *result,idx_t count,void *dataptr,bool adds_nulls,
               FunctionErrors errors)

{
  VectorType VVar1;
  bool bVar2;
  VectorType VVar3;
  ValidityMask *dataptr_00;
  idx_t iVar4;
  SelectionVector *pSVar5;
  ValidityMask *in_RCX;
  UnifiedVectorFormat *in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  undefined4 in_R8D;
  char in_R9B;
  uint uVar6;
  string_t sVar7;
  string_t *ldata_3;
  string_t *result_data_3;
  UnifiedVectorFormat vdata;
  SelectionVector *offsets;
  string_t *ldata_2;
  string_t *result_data_2;
  Vector *dictionary_values;
  optional_idx dict_size;
  string_t *ldata_1;
  string_t *result_data_1;
  string_t *ldata;
  string_t *result_data;
  Vector *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  idx_t in_stack_fffffffffffffe48;
  ValidityMask *in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  undefined8 in_stack_fffffffffffffe60;
  optional_idx *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe90;
  ValidityMask *in_stack_fffffffffffffe98;
  ValidityMask *in_stack_fffffffffffffea0;
  SelectionVector *in_stack_fffffffffffffea8;
  idx_t in_stack_fffffffffffffeb0;
  string_t *in_stack_fffffffffffffeb8;
  Vector *pVVar8;
  string_t *in_stack_fffffffffffffec0;
  void *in_stack_fffffffffffffed0;
  undefined1 uVar9;
  void *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined7 in_stack_ffffffffffffff00;
  UnifiedVectorFormat local_d8 [72];
  SelectionVector *local_90;
  string_t *local_88;
  string_t *local_80;
  Vector *local_78;
  optional_idx local_70;
  string_t *local_68;
  string_t *local_60;
  undefined8 local_58;
  char *local_50;
  undefined8 local_48;
  char *local_40;
  string_t *local_38;
  string_t *local_30;
  char local_22;
  byte local_21;
  undefined8 local_18;
  Vector *local_10;
  Vector *local_8;
  
  uVar9 = (undefined1)((ulong)in_stack_fffffffffffffe90 >> 0x38);
  local_21 = (byte)in_R8D & 1;
  local_22 = in_R9B;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == FLAT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_10);
    local_60 = FlatVector::GetData<duckdb::string_t>((Vector *)0xbdafec);
    local_68 = FlatVector::GetData<duckdb::string_t>((Vector *)0xbdb001);
    uVar9 = local_18._7_1_;
    dataptr_00 = FlatVector::Validity((Vector *)0xbdb046);
    FlatVector::Validity((Vector *)0xbdb05b);
    ExecuteFlat<duckdb::string_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::UnaryStringOperator<duckdb::Base64DecodeOperator>>
              ((string_t *)CONCAT17(VVar1,in_stack_ffffffffffffff00),(string_t *)in_RSI,
               (idx_t)in_RDX,in_RCX,(ValidityMask *)CONCAT44(in_R8D,in_stack_fffffffffffffee0),
               dataptr_00,(bool)uVar9);
  }
  else if (VVar1 == CONSTANT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_10);
    local_30 = ConstantVector::GetData<duckdb::string_t>((Vector *)0xbdaef6);
    local_38 = ConstantVector::GetData<duckdb::string_t>((Vector *)0xbdaf0b);
    bVar2 = ConstantVector::IsNull((Vector *)0xbdaf20);
    if (bVar2) {
      duckdb::ConstantVector::SetNull(local_10,true);
    }
    else {
      duckdb::ConstantVector::SetNull(local_10,false);
      local_58 = *(undefined8 *)&local_38->value;
      local_50 = (local_38->value).pointer.ptr;
      ConstantVector::Validity(local_10);
      sVar7.value.pointer.ptr = (char *)in_stack_fffffffffffffe60;
      sVar7.value._0_8_ = in_stack_fffffffffffffe58;
      sVar7 = GenericUnaryWrapper::
              Operation<duckdb::UnaryStringOperator<duckdb::Base64DecodeOperator>,duckdb::string_t,duckdb::string_t>
                        (sVar7,in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                         (void *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
      local_48 = sVar7.value._0_8_;
      *(undefined8 *)&local_30->value = local_48;
      local_40 = sVar7.value._8_8_;
      (local_30->value).pointer.ptr = local_40;
    }
  }
  else {
    if ((VVar1 == DICTIONARY_VECTOR) && (local_22 == '\0')) {
      local_70 = DictionaryVector::DictionarySize(in_stack_fffffffffffffe38);
      bVar2 = optional_idx::IsValid(&local_70);
      if ((bVar2) &&
         (iVar4 = optional_idx::GetIndex(in_stack_fffffffffffffe80),
         (UnifiedVectorFormat *)(iVar4 * 2) < local_18 || (long)(iVar4 * 2) - (long)local_18 == 0))
      {
        local_78 = DictionaryVector::Child((Vector *)0xbdb103);
        VVar3 = Vector::GetVectorType(local_78);
        if (VVar3 == FLAT_VECTOR) {
          local_80 = FlatVector::GetData<duckdb::string_t>((Vector *)0xbdb12d);
          uVar9 = (undefined1)((ulong)in_stack_fffffffffffffed0 >> 0x38);
          local_88 = FlatVector::GetData<duckdb::string_t>((Vector *)0xbdb142);
          optional_idx::GetIndex(in_stack_fffffffffffffe80);
          FlatVector::Validity((Vector *)0xbdb183);
          FlatVector::Validity((Vector *)0xbdb195);
          ExecuteFlat<duckdb::string_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::UnaryStringOperator<duckdb::Base64DecodeOperator>>
                    ((string_t *)CONCAT17(VVar1,in_stack_ffffffffffffff00),(string_t *)in_RSI,
                     (idx_t)in_RDX,in_RCX,(ValidityMask *)CONCAT44(in_R8D,in_stack_fffffffffffffee0)
                     ,in_stack_fffffffffffffed8,(bool)uVar9);
          local_90 = DictionaryVector::SelVector((Vector *)0xbdb1d5);
          pVVar8 = local_10;
          pSVar5 = (SelectionVector *)optional_idx::GetIndex(in_stack_fffffffffffffe80);
          duckdb::Vector::Dictionary(local_10,(ulong)pVVar8,pSVar5,(ulong)local_90);
          return;
        }
      }
    }
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(local_d8);
    duckdb::Vector::ToUnifiedFormat((ulong)local_8,local_18);
    duckdb::Vector::SetVectorType((VectorType)local_10);
    FlatVector::GetData<duckdb::string_t>((Vector *)0xbdb283);
    UnifiedVectorFormat::GetData<duckdb::string_t>(local_d8);
    FlatVector::Validity((Vector *)0xbdb2fa);
    uVar6 = local_21 & 1;
    ExecuteLoop<duckdb::string_t,duckdb::string_t,duckdb::GenericUnaryWrapper,duckdb::UnaryStringOperator<duckdb::Base64DecodeOperator>>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               in_stack_fffffffffffffed0,(bool)uVar9);
    UnifiedVectorFormat::~UnifiedVectorFormat
              ((UnifiedVectorFormat *)CONCAT44(in_stack_fffffffffffffe44,uVar6));
  }
  return;
}

Assistant:

static inline void ExecuteStandard(Vector &input, Vector &result, idx_t count, void *dataptr, bool adds_nulls,
	                                   FunctionErrors errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
			auto ldata = ConstantVector::GetData<INPUT_TYPE>(input);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				*result_data = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
				    *ldata, ConstantVector::Validity(result), 0, dataptr);
			}
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = FlatVector::GetData<INPUT_TYPE>(input);

			ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, FlatVector::Validity(input),
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector - we can run the function ONLY on the dictionary in some cases
			// we can only do this if the function does not throw errors
			// we can execute the function on a value that is in the dictionary but that is not referenced
			// if the function can throw errors - this will result in us (incorrectly) throwing an error
			if (errors == FunctionErrors::CANNOT_ERROR) {
				static constexpr idx_t DICTIONARY_THRESHOLD = 2;
				auto dict_size = DictionaryVector::DictionarySize(input);
				if (dict_size.IsValid() && dict_size.GetIndex() * DICTIONARY_THRESHOLD <= count) {
					// we can operate directly on the dictionary if we have a dictionary size
					// but this only makes sense if the dictionary size is smaller than the count by some factor
					auto &dictionary_values = DictionaryVector::Child(input);
					if (dictionary_values.GetVectorType() == VectorType::FLAT_VECTOR) {
						// execute the function over the dictionary
						auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
						auto ldata = FlatVector::GetData<INPUT_TYPE>(dictionary_values);
						ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(
						    ldata, result_data, dict_size.GetIndex(), FlatVector::Validity(dictionary_values),
						    FlatVector::Validity(result), dataptr, adds_nulls);
						// slice the result with the original offsets
						auto &offsets = DictionaryVector::SelVector(input);
						result.Dictionary(result, dict_size.GetIndex(), offsets, count);
						break;
					}
				}
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		}
#endif
		default: {
			UnifiedVectorFormat vdata;
			input.ToUnifiedFormat(count, vdata);

			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = UnifiedVectorFormat::GetData<INPUT_TYPE>(vdata);

			ExecuteLoop<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, vdata.sel, vdata.validity,
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		}
	}